

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# View.cpp
# Opt level: O3

void __thiscall sf::View::reset(View *this,FloatRect *rectangle)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  
  uVar1 = rectangle->left;
  uVar3 = rectangle->top;
  uVar2 = rectangle->width;
  uVar4 = rectangle->height;
  (this->m_center).x = (float)uVar2 * 0.5 + (float)uVar1;
  (this->m_center).y = (float)uVar4 * 0.5 + (float)uVar3;
  (this->m_size).x = (float)uVar2;
  (this->m_size).y = (float)uVar4;
  this->m_rotation = 0.0;
  this->m_transformUpdated = false;
  this->m_invTransformUpdated = false;
  return;
}

Assistant:

void View::reset(const FloatRect& rectangle)
{
    m_center.x = rectangle.left + rectangle.width / 2.f;
    m_center.y = rectangle.top + rectangle.height / 2.f;
    m_size.x   = rectangle.width;
    m_size.y   = rectangle.height;
    m_rotation = 0;

    m_transformUpdated    = false;
    m_invTransformUpdated = false;
}